

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O0

void __thiscall
COLLADAFW::
ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
::reallocMemory(ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                *this,size_t minCapacity)

{
  ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *capacity;
  void *pvVar1;
  ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *in_RSI;
  long *in_RDI;
  size_t newCapacity;
  
  if ((ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
       *)in_RDI[2] < in_RSI) {
    capacity = (ArrayPrimitiveType<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                *)(((ulong)(in_RDI[2] * 3) >> 1) + 1);
    if (capacity < in_RSI) {
      capacity = in_RSI;
    }
    in_RDI[2] = (long)capacity;
    if (*in_RDI == 0) {
      allocMemory(in_RSI,(size_t)capacity,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      pvVar1 = realloc((void *)*in_RDI,in_RDI[2] << 3);
      *in_RDI = (long)pvVar1;
      if ((ulong)in_RDI[2] < (ulong)in_RDI[1]) {
        in_RDI[1] = in_RDI[2];
      }
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}